

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

void ecpDblAJ(word *b,word *a,ec_o *ec,void *stack)

{
  word *a_00;
  word *c;
  word *b_00;
  word *b_01;
  word *pwVar1;
  word *c_00;
  size_t n;
  bool_t bVar2;
  
  n = ec->f->n;
  a_00 = a + n;
  bVar2 = wwIsZero(a_00,n);
  if (bVar2 != 0) {
    wwSetZero(b + n * 2,ec->f->n);
    return;
  }
  c = (word *)((long)stack + n * 8);
  b_00 = c + n;
  b_01 = b_00 + n;
  pwVar1 = b_01 + n;
  (*ec->f->sqr)((word *)stack,a,ec->f,pwVar1);
  (*ec->f->sqr)(c,a_00,ec->f,pwVar1);
  (*ec->f->sqr)(b_00,c,ec->f,pwVar1);
  zzAddMod(c,c,a,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(c,c,ec->f,pwVar1);
  zzSubMod(c,c,(word *)stack,ec->f->mod,ec->f->n);
  zzSubMod(c,c,b_00,ec->f->mod,ec->f->n);
  zzDoubleMod(c,c,ec->f->mod,ec->f->n);
  zzDoubleMod(b_01,(word *)stack,ec->f->mod,ec->f->n);
  zzAddMod(b_01,b_01,(word *)stack,ec->f->mod,ec->f->n);
  zzAddMod(b_01,b_01,ec->A,ec->f->mod,ec->f->n);
  zzDoubleMod((word *)stack,c,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(b,b_01,ec->f,pwVar1);
  zzSubMod(b,b,(word *)stack,ec->f->mod,ec->f->n);
  c_00 = b + n;
  zzDoubleMod(c_00 + n,a_00,ec->f->mod,ec->f->n);
  zzSubMod(c,c,b,ec->f->mod,ec->f->n);
  (*ec->f->mul)(c_00,b_01,c,ec->f,pwVar1);
  zzDoubleMod(b_00,b_00,ec->f->mod,ec->f->n);
  zzDoubleMod(b_00,b_00,ec->f->mod,ec->f->n);
  zzDoubleMod(b_00,b_00,ec->f->mod,ec->f->n);
  zzSubMod(c_00,c_00,b_00,ec->f->mod,ec->f->n);
  return;
}

Assistant:

static void ecpDblAJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	stack = t4 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 2 * n, b, 3 * n));
	// ya == 0? => b <- O
	if (qrIsZero(ecY(a, n), ec->f))
	{
		qrSetZero(ecZ(b, n), ec->f);
		return;
	}
	// t1 <- xa^2 [X1^2 = XX]
	qrSqr(t1, ecX(a), ec->f, stack);
	// t2 <- ya^2 [Y1^2 = YY]
	qrSqr(t2, ecY(a, n), ec->f, stack);
	// t3 <- t2^2 [YY^2 = YYYY]
	qrSqr(t3, t2, ec->f, stack);
	// t2 <- t2 + xa [X1 + YY]
	zmAdd(t2, t2, ecX(a), ec->f);
	// t2 <- t2^2 [(X1 + YY)^2]
	qrSqr(t2, t2, ec->f, stack);
	// t2 <- t2 - t1 [(X1 + YY)^2 - XX]
	zmSub(t2, t2, t1, ec->f);
	// t2 <- t2 - t3 [(X1 + YY)^2 - XX - YYYY]
	zmSub(t2, t2, t3, ec->f);
	// t2 <- 2 t2 [2((X1 + YY)^2 - XX - YYYY) = S]
	gfpDouble(t2, t2, ec->f);
	// t4 <- 2 t1 [2 XX]
	gfpDouble(t4, t1, ec->f);
	// t4 <- t4 + t1 [3 XX]
	zmAdd(t4, t4, t1, ec->f);
	// t4 <- t4 + A [3 XX + A = M]
	zmAdd(t4, t4, ec->A, ec->f);
	// t1 <- 2 t2 [2S]
	gfpDouble(t1, t2, ec->f);
	// xb <- t4^2 [M^2]
	qrSqr(ecX(b), t4, ec->f, stack);
	// xb <- xb - t1 [M^2 - 2S = T]
	zmSub(ecX(b), ecX(b), t1, ec->f);
	// zb <- 2 ya [2Y1]
	gfpDouble(ecZ(b, n), ecY(a, n), ec->f);
	// t2 <- t2 - xb [S - T]
	zmSub(t2, t2, ecX(b), ec->f);
	// yb <- t4 t2 [M(S - T)]
	qrMul(ecY(b, n), t4, t2, ec->f, stack);
	// t3 <- 2 t3 [2 YYYY]
	gfpDouble(t3, t3, ec->f);
	// t3 <- 2 t3 [4 YYYY]
	gfpDouble(t3, t3, ec->f);
	// t3 <- 2 t3 [8 YYYY]
	gfpDouble(t3, t3, ec->f);
	// yb <- yb - t3 [M(S - T) - 8 YYYY]
	zmSub(ecY(b, n), ecY(b, n), t3, ec->f);
}